

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_15::BinaryReaderIR::SetFuncDeclaration
          (BinaryReaderIR *this,FuncDeclaration *decl,Var *var)

{
  FuncType *pFVar1;
  FuncType *func_type;
  Var *var_local;
  FuncDeclaration *decl_local;
  BinaryReaderIR *this_local;
  
  decl->has_func_type = true;
  Var::operator=(&decl->type_var,var);
  pFVar1 = Module::GetFuncType(this->module_,var);
  if (pFVar1 != (FuncType *)0x0) {
    FuncSignature::operator=(&decl->sig,&pFVar1->sig);
  }
  return;
}

Assistant:

void BinaryReaderIR::SetFuncDeclaration(FuncDeclaration* decl, Var var) {
  decl->has_func_type = true;
  decl->type_var = var;
  if (auto* func_type = module_->GetFuncType(var)) {
    decl->sig = func_type->sig;
  }
}